

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create.c
# Opt level: O0

tgestate_t * tge_create(zxspectrum_t *speccy)

{
  tgestate_t *__ptr;
  size_t __size;
  size_t sVar1;
  size_t __size_00;
  size_t __size_01;
  zxspectrum_t *in_RDI;
  supertileindex_t *map_buf;
  uint8_t *window_buf;
  tileindex_t *tile_buf;
  size_t map_buf_size;
  size_t window_buf_size;
  size_t window_buf_stride;
  size_t tile_buf_size;
  tgestate_t *state;
  supertileindex_t *local_50;
  uint8_t *local_48;
  tileindex_t *local_40;
  
  local_40 = (tileindex_t *)0x0;
  local_48 = (uint8_t *)0x0;
  local_50 = (supertileindex_t *)0x0;
  __ptr = (tgestate_t *)calloc(1,0x7b0);
  if (__ptr != (tgestate_t *)0x0) {
    __ptr->width = (in_RDI->screen).width;
    __ptr->height = (in_RDI->screen).height;
    __ptr->columns = 0x18;
    __ptr->rows = 0x11;
    __ptr->st_columns = 7;
    __ptr->st_rows = 5;
    __size = (size_t)(__ptr->columns * __ptr->rows);
    sVar1 = (size_t)(__ptr->columns << 3);
    __size_00 = sVar1 * (long)__ptr->rows + 8;
    __size_01 = (size_t)(__ptr->st_columns * __ptr->st_rows);
    __ptr->tile_buf_size = __size;
    __ptr->window_buf_stride = sVar1;
    __ptr->window_buf_size = __size_00;
    __ptr->map_buf_size = __size_01;
    local_40 = (tileindex_t *)calloc(1,__size);
    local_48 = (uint8_t *)calloc(1,__size_00);
    local_50 = (supertileindex_t *)calloc(1,__size_01);
    if (((local_40 != (tileindex_t *)0x0) && (local_48 != (uint8_t *)0x0)) &&
       (local_50 != (supertileindex_t *)0x0)) {
      __ptr->tile_buf = local_40;
      __ptr->window_buf = local_48;
      __ptr->map_buf = local_50;
      __ptr->prng_index = '\0';
      __ptr->speccy = in_RDI;
      tge_initialise((tgestate_t *)0x105efb);
      return __ptr;
    }
  }
  free(local_50);
  free(local_48);
  free(local_40);
  free(__ptr);
  return (tgestate_t *)0x0;
}

Assistant:

TGE_API tgestate_t *tge_create(zxspectrum_t *speccy)
{
  tgestate_t       *state      = NULL;
  size_t            tile_buf_size;
  size_t            window_buf_stride;
  size_t            window_buf_size;
  size_t            map_buf_size;
  tileindex_t      *tile_buf   = NULL;
  uint8_t          *window_buf = NULL;
  supertileindex_t *map_buf    = NULL;

  /* Allocate state structure. */

  state = calloc(1, sizeof(*state));
  if (state == NULL)
    goto failure;

  /* Configure. */

  // Until we can resize...
  assert(speccy->screen.width  == 32);
  assert(speccy->screen.height == 24);

  state->width      = speccy->screen.width;
  state->height     = speccy->screen.height;

  /* Set the dimensions of the window buffer. When painted onto the game
   * screen the window is one unit smaller in both dimensions. That is a
   * 24x17 buffer is displayed through a 23x16 window on-screen. This allows
   * for rolling/scrolling. */
  state->columns    = 24;
  state->rows       = 17;

  /* Set the dimensions of the supertile buffer. This is held separately,
   * rather than computed from columns and rows, as it's wider than I
   * expected it to be. */
  state->st_columns = 7; // try  = (state->columns + 1) / 4; /* +1 is a fudge */
  state->st_rows    = 5; // try  = (state->rows       ) / 4;

  /* Size and allocate buffers. */

  tile_buf_size     = state->columns * state->rows;
  window_buf_stride = state->columns * 8;
  /* 8 bytes of padding are appended to the end of the window buffer - the
   * same as in the original game - to allow for plotting routine overruns.
   */
  window_buf_size   = window_buf_stride * state->rows + 8;
  map_buf_size      = state->st_columns * state->st_rows;

  state->tile_buf_size     = tile_buf_size;
  state->window_buf_stride = window_buf_stride;
  state->window_buf_size   = window_buf_size;
  state->map_buf_size      = map_buf_size;

  tile_buf   = calloc(1, tile_buf_size);
  window_buf = calloc(1, window_buf_size);
  map_buf    = calloc(1, map_buf_size);

  if (tile_buf   == NULL ||
      window_buf == NULL ||
      map_buf    == NULL)
    goto failure;

  state->tile_buf   = tile_buf;
  state->window_buf = window_buf;
  state->map_buf    = map_buf;

  state->prng_index = 0;

  /* Initialise additional variables. */

  state->speccy = speccy;

  /* Initialise original game variables. */

  tge_initialise(state);

  return state;


failure:

  free(map_buf);
  free(window_buf);
  free(tile_buf);
  free(state);

  return NULL;
}